

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

N_Vector N_VCloneEmpty(N_Vector w)

{
  N_Vector p_Var1;
  long in_RDI;
  N_Vector result;
  
  p_Var1 = (N_Vector)(**(code **)(*(long *)(in_RDI + 8) + 0x10))(in_RDI);
  if (p_Var1 != (N_Vector)0x0) {
    p_Var1->sunctx = *(SUNContext *)(in_RDI + 0x10);
  }
  return p_Var1;
}

Assistant:

N_Vector N_VCloneEmpty(N_Vector w)
{
  N_Vector result;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(w));
  result = w->ops->nvcloneempty(w);
  if (result) { result->sunctx = w->sunctx; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(w));
  return result;
}